

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O1

void __thiscall
ASCFile::parse_pin(ASCFile *this,char **p,char **s,char **arena,char **arena_end,
                  line_iterator_t *line_it)

{
  pointer *ppBVar1;
  string *this_00;
  byte bVar2;
  BRDPartMountingSide BVar3;
  iterator __position;
  ASCFile *pAVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong **__dest;
  long *plVar8;
  char *pcVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  long *plVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  double dVar16;
  size_type __dnew;
  BRDPin pin;
  ulong *local_1a0;
  long local_198;
  ulong local_190 [2];
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  ASCFile *local_140;
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  char *pcStack_110;
  uint uStack_108;
  int iStack_104;
  int iStack_100;
  BRDPoint BStack_fc;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong **local_90;
  ulong *local_88;
  ulong *local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (this->m_firstpin == true) {
    line_it->_M_current = line_it->_M_current + 7;
    this->m_firstpin = false;
    return;
  }
  pcVar9 = *p;
  iVar6 = strncmp(pcVar9,"Part",4);
  if (iVar6 == 0) {
    pbVar14 = (byte *)(pcVar9 + 4);
    *p = (char *)pbVar14;
    local_138._8_8_ = &aStack_120;
    local_138._0_4_ = 0;
    local_138._4_4_ = 0;
    local_138._16_8_ = 0;
    aStack_120._M_allocated_capacity = aStack_120._M_allocated_capacity & 0xffffffffffffff00;
    pcStack_110 = (char *)0x0;
    uStack_108 = 0;
    iStack_104 = 0;
    iStack_100 = 0;
    BStack_fc.x = 0;
    BStack_fc.y = 0;
    bVar5 = pcVar9[4];
    if (bVar5 != 0) {
      pbVar14 = (byte *)(pcVar9 + 5);
      do {
        iVar6 = isspace((uint)bVar5);
        if (iVar6 == 0) break;
        *p = (char *)pbVar14;
        bVar5 = *pbVar14;
        pbVar14 = pbVar14 + 1;
      } while (bVar5 != 0);
      pbVar14 = pbVar14 + -1;
    }
    *s = (char *)pbVar14;
    pbVar14 = (byte *)*p;
    bVar5 = *pbVar14;
    if (bVar5 != 0) {
      pbVar14 = pbVar14 + 1;
      do {
        iVar6 = isspace((uint)bVar5);
        if (iVar6 != 0) break;
        *p = (char *)pbVar14;
        bVar5 = *pbVar14;
        pbVar14 = pbVar14 + 1;
      } while (bVar5 != 0);
      pbVar14 = pbVar14 + -1;
    }
    *pbVar14 = 0;
    *p = *p + 1;
    local_138._0_8_ = fix_to_utf8(*s,arena,*arena_end);
    pcStack_110 = (char *)((ulong)pcStack_110 & 0xffffffff);
    pbVar14 = (byte *)*p;
    bVar5 = *pbVar14;
    if (bVar5 != 0) {
      pbVar14 = pbVar14 + 1;
      do {
        iVar6 = isspace((uint)bVar5);
        if (iVar6 == 0) break;
        *p = (char *)pbVar14;
        bVar5 = *pbVar14;
        pbVar14 = pbVar14 + 1;
      } while (bVar5 != 0);
      pbVar14 = pbVar14 + -1;
    }
    *s = (char *)pbVar14;
    pbVar14 = (byte *)*p;
    bVar5 = *pbVar14;
    if (bVar5 != 0) {
      pbVar14 = pbVar14 + 1;
      do {
        iVar6 = isspace((uint)bVar5);
        if (iVar6 != 0) break;
        *p = (char *)pbVar14;
        bVar5 = *pbVar14;
        pbVar14 = pbVar14 + 1;
      } while (bVar5 != 0);
      pbVar14 = pbVar14 + -1;
    }
    *pbVar14 = 0;
    *p = *p + 1;
    pcVar9 = fix_to_utf8(*s,arena,*arena_end);
    iVar6 = strcmp(pcVar9,"(T)");
    pcStack_110 = (char *)CONCAT44(pcStack_110._4_4_,(iVar6 == 0) + Bottom);
    uStack_108 = 0;
    std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
              (&(this->super_BRDFileBase).parts,(value_type *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._8_8_ == &aStack_120) {
      return;
    }
    operator_delete((void *)local_138._8_8_,aStack_120._M_allocated_capacity + 1);
    return;
  }
  local_138._0_4_ = 0;
  local_138._4_4_ = 0;
  local_138._16_8_ = (ulong)(uint)local_138._20_4_ << 0x20;
  aStack_120._M_allocated_capacity = 0x1ed23f;
  aStack_120._8_8_ = 0.5;
  pcStack_110 = (char *)0x0;
  uStack_108 = 0;
  iStack_104 = 0;
  local_138._8_8_ =
       (ulong)(uint)((int)((ulong)((long)(this->super_BRDFileBase).parts.
                                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->super_BRDFileBase).parts.
                                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39
                    ) << 0x20;
  strtol(pcVar9,p,10);
  pbVar14 = (byte *)*p;
  bVar5 = *pbVar14;
  local_140 = this;
  if (bVar5 != 0) {
    pbVar14 = pbVar14 + 1;
    do {
      iVar6 = isspace((uint)bVar5);
      if (iVar6 == 0) break;
      *p = (char *)pbVar14;
      bVar5 = *pbVar14;
      pbVar14 = pbVar14 + 1;
    } while (bVar5 != 0);
    pbVar14 = pbVar14 + -1;
  }
  *s = (char *)pbVar14;
  pbVar14 = (byte *)*p;
  bVar5 = *pbVar14;
  if (bVar5 != 0) {
    pbVar15 = pbVar14 + 1;
    do {
      bVar2 = *pbVar15;
      if (bVar2 == 0) break;
      iVar6 = isspace((uint)bVar5);
      if ((iVar6 != 0) && (iVar6 = isspace((uint)bVar2), iVar6 != 0)) goto LAB_00129640;
      pbVar14 = pbVar14 + 1;
      *p = (char *)pbVar15;
      bVar5 = *pbVar15;
      pbVar15 = pbVar15 + 1;
    } while (bVar5 != 0);
    pbVar14 = pbVar15 + -1;
  }
LAB_00129640:
  *pbVar14 = 0;
  *p = *p + 1;
  fix_to_utf8(*s,arena,*arena_end);
  dVar16 = strtod(*p,p);
  local_138._0_4_ = (int)(dVar16 * 1000.0);
  dVar16 = strtod(*p,p);
  local_138._4_4_ = (int)(dVar16 * 1000.0);
  strtol(*p,p,10);
  pAVar4 = local_140;
  pbVar14 = (byte *)*p;
  bVar5 = *pbVar14;
  if (bVar5 != 0) {
    pbVar14 = pbVar14 + 1;
    do {
      iVar6 = isspace((uint)bVar5);
      if (iVar6 == 0) break;
      *p = (char *)pbVar14;
      bVar5 = *pbVar14;
      pbVar14 = pbVar14 + 1;
    } while (bVar5 != 0);
    pbVar14 = pbVar14 + -1;
  }
  *s = (char *)pbVar14;
  pbVar14 = (byte *)*p;
  bVar5 = *pbVar14;
  if (bVar5 != 0) {
    pbVar14 = pbVar14 + 1;
    do {
      iVar6 = isspace((uint)bVar5);
      if (iVar6 != 0) break;
      *p = (char *)pbVar14;
      bVar5 = *pbVar14;
      pbVar14 = pbVar14 + 1;
    } while (bVar5 != 0);
    pbVar14 = pbVar14 + -1;
  }
  *pbVar14 = 0;
  *p = *p + 1;
  aStack_120._M_allocated_capacity = (size_type)fix_to_utf8(*s,arena,*arena_end);
  lVar7 = strtol(*p,p,10);
  iVar6 = (int)lVar7;
  if (-1 < iVar6) goto LAB_00129cfd;
  local_90 = local_80;
  local_1a0 = (ulong *)0x79;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_1a0);
  puVar11 = local_1a0;
  local_80[0] = local_1a0;
  local_90 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/ASCFile.cpp"
         ,0x79);
  local_88 = puVar11;
  *(undefined1 *)((long)__dest + (long)puVar11) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_170 = *puVar11;
    lStack_168 = plVar8[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar11;
    local_180 = (ulong *)*plVar8;
  }
  local_178 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x02');
  *(undefined2 *)local_1a0 = 0x3036;
  uVar13 = 0xf;
  if (local_180 != &local_170) {
    uVar13 = local_170;
  }
  if (uVar13 < (ulong)(local_198 + local_178)) {
    uVar13 = 0xf;
    if (local_1a0 != local_190) {
      uVar13 = local_190[0];
    }
    if (uVar13 < (ulong)(local_198 + local_178)) goto LAB_00129952;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_00129952:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0);
  }
  local_160 = &local_150;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_150 = *plVar8;
    uStack_148 = puVar10[3];
  }
  else {
    local_150 = *plVar8;
    local_160 = (long *)*puVar10;
  }
  local_158 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_f0 = &local_e0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar8[3];
  }
  else {
    local_e0 = *plVar12;
    local_f0 = (long *)*plVar8;
  }
  local_e8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_d0 = &local_c0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_c0 = *plVar12;
    lStack_b8 = plVar8[3];
  }
  else {
    local_c0 = *plVar12;
    local_d0 = (long *)*plVar8;
  }
  local_c8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0 = &local_a0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_a0 = *plVar12;
    lStack_98 = plVar8[3];
  }
  else {
    local_a0 = *plVar12;
    local_b0 = (long *)*plVar8;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_40 = *plVar12;
    lStack_38 = plVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar12;
    local_50 = (long *)*plVar8;
  }
  local_48 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  this_00 = &(pAVar4->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(long)local_80[0] + 1);
  }
  SDL_LogError(1,"%s",(this_00->_M_dataplus)._M_p);
LAB_00129cfd:
  local_138._8_4_ = iVar6;
  BVar3 = (pAVar4->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].mounting_side;
  if (BVar3 < (Top|Bottom)) {
    local_138._16_4_ = BVar3;
  }
  __position._M_current =
       (pAVar4->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pAVar4->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
              ((vector<BRDPin,std::allocator<BRDPin>> *)&(pAVar4->super_BRDFileBase).pins,__position
               ,(BRDPin *)local_138);
  }
  else {
    (__position._M_current)->name = (char *)CONCAT44(iStack_104,uStack_108);
    (__position._M_current)->radius = (double)aStack_120._8_8_;
    (__position._M_current)->snum = pcStack_110;
    *(undefined8 *)&(__position._M_current)->side = local_138._16_8_;
    (__position._M_current)->net = (char *)aStack_120._M_allocated_capacity;
    ((__position._M_current)->pos).x = local_138._0_4_;
    ((__position._M_current)->pos).y = local_138._4_4_;
    (__position._M_current)->probe = iVar6;
    (__position._M_current)->part = local_138._12_4_;
    ppBVar1 = &(pAVar4->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  (pAVar4->super_BRDFileBase).parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].end_of_pins =
       (int)((ulong)((long)(pAVar4->super_BRDFileBase).pins.
                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pAVar4->super_BRDFileBase).pins.
                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  return;
}

Assistant:

void ASCFile::parse_pin(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstpin) {
		line_it += 7; // Skip 7+1 unused lines before 1st part
		m_firstpin = false;
		return;
	}
	if (!strncmp(p, "Part", 4)) {
		p += 4; // Skip "Part" string
		BRDPart part;

		part.name      = READ_STR();
		part.part_type = BRDPartType::SMD;
		char *loc      = READ_STR();
		if (!strcmp(loc, "(T)"))
			part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
		else
			part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
		part.end_of_pins       = 0;
		parts.push_back(part);
	} else {
		BRDPin pin;

		pin.part = parts.size();
		/*int id =*/READ_INT(); // uint
		/*char *name =*/READ_STR2();
		double posx = READ_DOUBLE();
		pin.pos.x   = posx * 1000.0f;
		double posy = READ_DOUBLE();
		pin.pos.y   = posy * 1000.0f;
		/*int layer =*/READ_INT(); // uint
		pin.net   = READ_STR();
		pin.probe = READ_UINT();
		switch (parts.back().mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
		pins.push_back(pin);
		parts.back().end_of_pins = pins.size();
	}
}